

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

uint RDL_getRCyclesForRCF(RDL_data *data,uint index,RDL_cycle ***ptr)

{
  RDL_cycleIterator *it_00;
  RDL_cycle **ppRVar1;
  RDL_cycleIterator *it;
  RDL_cycle ***ptr_local;
  uint index_local;
  RDL_data *data_local;
  
  it_00 = RDL_getRCyclesForRCFIterator(data,index);
  if (it_00 == (RDL_cycleIterator *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"Iterator is NULL!\n");
    ppRVar1 = (RDL_cycle **)malloc(8);
    *ptr = ppRVar1;
    data_local._4_4_ = 0xffffffff;
  }
  else {
    data_local._4_4_ = RDL_getRCycles_internal(data,ptr,it_00);
  }
  return data_local._4_4_;
}

Assistant:

unsigned RDL_getRCyclesForRCF(const RDL_data *data, unsigned index, RDL_cycle ***ptr)
{
  RDL_cycleIterator* it;

  it = RDL_getRCyclesForRCFIterator(data, index);

  if (it == NULL) {
    RDL_outputFunc(RDL_ERROR, "Iterator is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  return RDL_getRCycles_internal(data, ptr, it);
}